

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

bool __thiscall StatisticsApp::display(StatisticsApp *this)

{
  ostream *poVar1;
  allocator<char> local_131;
  string local_130;
  code *local_110;
  undefined8 local_108;
  allocator<char> local_f9;
  string local_f8;
  code *local_d8;
  undefined8 local_d0;
  allocator<char> local_c1;
  string local_c0;
  code *local_a0;
  undefined8 local_98;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  StatisticsWriter writer;
  StatisticsApp *this_local;
  
  writer._comment.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"#",&local_51);
  StatisticsWriter::StatisticsWriter((StatisticsWriter *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if (((this->_options).showStatistics & 1U) != 0) {
    StatisticsWriter::writeStatistics
              ((StatisticsWriter *)local_30,this->_outputStream,&this->_tracker);
  }
  if (((this->_options).showCovariance & 1U) != 0) {
    poVar1 = this->_outputStream;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Covariance",&local_89);
    local_a0 = MultivariateTracker::getCovariance;
    local_98 = 0;
    StatisticsWriter::writeMatrix<double>
              ((StatisticsWriter *)local_30,poVar1,&this->_tracker,&local_88,0x1ac310);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  if (((this->_options).showCorrelation & 1U) != 0) {
    poVar1 = this->_outputStream;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Correlation",&local_c1);
    local_d8 = MultivariateTracker::getCorrelation;
    local_d0 = 0;
    StatisticsWriter::writeMatrix<double>
              ((StatisticsWriter *)local_30,poVar1,&this->_tracker,&local_c0,0x1bd110);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  if (((this->_options).showLeastSquaresOffset & 1U) != 0) {
    poVar1 = this->_outputStream;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Offset",&local_f9);
    local_110 = MultivariateTracker::getLeastSquaresOffset;
    local_108 = 0;
    StatisticsWriter::writeMatrix<double>
              ((StatisticsWriter *)local_30,poVar1,&this->_tracker,&local_f8,0x1bd1a0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  if (((this->_options).showLeastSquaresSlope & 1U) != 0) {
    poVar1 = this->_outputStream;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Slope",&local_131);
    StatisticsWriter::writeMatrix<double>
              ((StatisticsWriter *)local_30,poVar1,&this->_tracker,&local_130,0x1bd220);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  if (((this->_options).showHistogram & 1U) != 0) {
    StatisticsWriter::writeHistograms
              ((StatisticsWriter *)local_30,this->_outputStream,&this->_tracker);
  }
  StatisticsWriter::~StatisticsWriter((StatisticsWriter *)local_30);
  return true;
}

Assistant:

bool
    display()
    {

        // ==================================================
        // Write output to stream
        // --------------------------------------------------
        StatisticsWriter writer;
        
        // Show statistics
        if (this->_options.showStatistics)
        {
            writer.writeStatistics(*this->_outputStream, this->_tracker);
        }
        
        // Show covariance
        if (this->_options.showCovariance)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Covariance", &MultivariateTracker::getCovariance);
        }

        // Show correlation
        if (this->_options.showCorrelation)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Correlation", &MultivariateTracker::getCorrelation);
        }

        // Show least squares fit offset
        if (this->_options.showLeastSquaresOffset)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Offset", &MultivariateTracker::getLeastSquaresOffset);
        }

        // Show least squares fit slope
        if (this->_options.showLeastSquaresSlope)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Slope", &MultivariateTracker::getLeastSquaresSlope);
        }
        
        // Show histogram
        if (this->_options.showHistogram)
        {
            writer.writeHistograms(*this->_outputStream, this->_tracker);
        }

        return true;

    }